

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkreplyimpl_p.cpp
# Opt level: O3

void QNetworkReplyImpl::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      QNetworkReplyImplPrivate::_q_startOperation(*(QNetworkReplyImplPrivate **)(_o + 8));
      return;
    case 1:
    case 2:
      QNetworkReplyImplPrivate::_q_copyReadyRead(*(QNetworkReplyImplPrivate **)(_o + 8));
      return;
    case 3:
      QNetworkReplyImplPrivate::_q_bufferOutgoingData(*(QNetworkReplyImplPrivate **)(_o + 8));
      return;
    case 4:
      QNetworkReplyImplPrivate::_q_bufferOutgoingDataFinished
                (*(QNetworkReplyImplPrivate **)(_o + 8));
      return;
    }
  }
  return;
}

Assistant:

void QNetworkReplyImpl::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNetworkReplyImpl *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->d_func()->_q_startOperation(); break;
        case 1: _t->d_func()->_q_copyReadyRead(); break;
        case 2: _t->d_func()->_q_copyReadChannelFinished(); break;
        case 3: _t->d_func()->_q_bufferOutgoingData(); break;
        case 4: _t->d_func()->_q_bufferOutgoingDataFinished(); break;
        default: ;
        }
    }
    (void)_a;
}